

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

uint8_t * google::protobuf::internal::WireFormat::InternalSerializeUnknownMessageSetItemsToArray
                    (UnknownFieldSet *unknown_fields,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint uVar2;
  uint8_t *puVar3;
  uint uVar4;
  long lVar5;
  pointer pUVar6;
  
  pUVar6 = (unknown_fields->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(unknown_fields->fields_).
                              super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar6) >> 4)) {
    lVar5 = 0;
    do {
      if (pUVar6[lVar5].type_ == 3) {
        if (stream->end_ <= target) {
          target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        target[0] = '\v';
        target[1] = '\x10';
        uVar4 = pUVar6[lVar5].number_;
        target[2] = (byte)uVar4;
        if (uVar4 < 0x80) {
          puVar3 = target + 3;
        }
        else {
          target[2] = (byte)uVar4 | 0x80;
          target[3] = (uint8_t)(uVar4 >> 7);
          puVar3 = target + 4;
          if (0x3fff < uVar4) {
            uVar2 = (uint)target[3];
            uVar4 = uVar4 >> 7;
            do {
              puVar3[-1] = (byte)uVar2 | 0x80;
              uVar2 = uVar4 >> 7;
              *puVar3 = (uint8_t)uVar2;
              puVar3 = puVar3 + 1;
              bVar1 = 0x3fff < uVar4;
              uVar4 = uVar2;
            } while (bVar1);
          }
        }
        *puVar3 = '\x1a';
        puVar3 = UnknownField::InternalSerializeLengthDelimitedNoTag
                           (pUVar6 + lVar5,puVar3 + 1,stream);
        if (stream->end_ <= puVar3) {
          puVar3 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar3);
        }
        *puVar3 = '\f';
        target = puVar3 + 1;
      }
      lVar5 = lVar5 + 1;
      pUVar6 = (unknown_fields->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar5 < (int)((ulong)((long)(unknown_fields->fields_).
                                         super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar6)
                          >> 4));
  }
  return target;
}

Assistant:

uint8_t* WireFormat::InternalSerializeUnknownMessageSetItemsToArray(
    const UnknownFieldSet& unknown_fields, uint8_t* target,
    io::EpsCopyOutputStream* stream) {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    // The only unknown fields that are allowed to exist in a MessageSet are
    // messages, which are length-delimited.
    if (field.type() == UnknownField::TYPE_LENGTH_DELIMITED) {
      target = stream->EnsureSpace(target);
      // Start group.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetItemStartTag, target);

      // Write type ID.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetTypeIdTag, target);
      target =
          io::CodedOutputStream::WriteVarint32ToArray(field.number(), target);

      // Write message.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetMessageTag, target);

      target = field.InternalSerializeLengthDelimitedNoTag(target, stream);

      target = stream->EnsureSpace(target);
      // End group.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetItemEndTag, target);
    }
  }

  return target;
}